

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

CTcPrsNode * CTcPrsOpUnary::parse_inc(int pre,CTcPrsNode *subexpr)

{
  int iVar1;
  char *pcVar2;
  CTcPrsNode *pCVar3;
  undefined *puVar4;
  
  iVar1 = (*(subexpr->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[3])(subexpr);
  if (iVar1 == 0) {
    pcVar2 = CTcTokenizer::get_op_text(TOKT_INC);
    CTcTokenizer::log_error(0x2afe,pcVar2);
  }
  pCVar3 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x10);
  pCVar3[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)subexpr;
  if (pre == 0) {
    puVar4 = &CTPNPostInc::vtable;
  }
  else {
    puVar4 = &CTPNPreInc::vtable;
  }
  (pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)(puVar4 + 0x10);
  return pCVar3;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_inc(int pre, CTcPrsNode *subexpr)
{
    /* require an lvalue */
    if (!subexpr->check_lvalue())
    {
        /* log an error, but continue parsing */
        G_tok->log_error(TCERR_INVALID_UNARY_LVALUE,
                         G_tok->get_op_text(TOKT_INC));
    }

    /* apply the increment operator */
    if (pre)
        return new CTPNPreInc(subexpr);
    else
        return new CTPNPostInc(subexpr);
}